

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O0

Ray * perspective_camera_ray(Ray *__return_storage_ptr__,PerspectiveCamera cam,float sx,float sy)

{
  PerspectiveCamera PVar1;
  Vec3 VVar2;
  Ray *r;
  undefined8 local_a0;
  float local_98;
  Vec3 basis_ray;
  float sy_local;
  float sx_local;
  
  PVar1 = cam;
  VVar2.y = cam.yscale * (sy + sy + -1.0);
  VVar2.x = cam.xscale * (sx + sx + -1.0);
  VVar2.z = -cam.depth;
  VVar2 = normalized(VVar2);
  (__return_storage_ptr__->o).z = cam.eye.z;
  (__return_storage_ptr__->o).x = cam.eye.x;
  (__return_storage_ptr__->o).y = cam.eye.y;
  cam.basis[0] = PVar1.basis[0];
  cam.basis[1] = PVar1.basis[1];
  cam.basis[2] = PVar1.basis[2];
  VVar2 = basis2world(VVar2,cam.basis[0],cam.basis[1],cam.basis[2]);
  local_a0 = VVar2._0_8_;
  (__return_storage_ptr__->d).x = (float)(undefined4)local_a0;
  (__return_storage_ptr__->d).y = (float)local_a0._4_4_;
  local_98 = VVar2.z;
  (__return_storage_ptr__->d).z = local_98;
  return __return_storage_ptr__;
}

Assistant:

Ray perspective_camera_ray(PerspectiveCamera cam, float sx, float sy) {
    Vec3 basis_ray = normalized(
        (Vec3){ cam.xscale * (-1.0f + 2.0f * sx),
                cam.yscale * (-1.0f + 2.0f * sy),
                -cam.depth
                }
        );
    Ray r = {
        .o = cam.eye,
        .d = basis2world(
            basis_ray,
            cam.basis[0], cam.basis[1], cam.basis[2]
            )
    };
    return r;
}